

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RtAudio.cpp
# Opt level: O0

uint __thiscall RtApi::formatBytes(RtApi *this,RtAudioFormat format)

{
  RtAudioFormat format_local;
  RtApi *this_local;
  
  if (format == 2) {
    this_local._4_4_ = 2;
  }
  else if ((format == 8) || (format == 0x10)) {
    this_local._4_4_ = 4;
  }
  else if (format == 0x20) {
    this_local._4_4_ = 8;
  }
  else if (format == 4) {
    this_local._4_4_ = 3;
  }
  else if (format == 1) {
    this_local._4_4_ = 1;
  }
  else {
    std::__cxx11::string::operator=
              ((string *)&this->errorText_,"RtApi::formatBytes: undefined format.");
    error(this,RTAUDIO_WARNING);
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

unsigned int RtApi :: formatBytes( RtAudioFormat format )
{
  if ( format == RTAUDIO_SINT16 )
    return 2;
  else if ( format == RTAUDIO_SINT32 || format == RTAUDIO_FLOAT32 )
    return 4;
  else if ( format == RTAUDIO_FLOAT64 )
    return 8;
  else if ( format == RTAUDIO_SINT24 )
    return 3;
  else if ( format == RTAUDIO_SINT8 )
    return 1;

  errorText_ = "RtApi::formatBytes: undefined format.";
  error( RTAUDIO_WARNING );

  return 0;
}